

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::TSPI_PDU::operator==(TSPI_PDU *this,TSPI_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  KFIXED<short,_(unsigned_char)__x03_> local_30;
  TSPI_PDU *local_20;
  TSPI_PDU *Value_local;
  TSPI_PDU *this_local;
  
  local_20 = Value;
  Value_local = this;
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->m_TSPIFlagUnion).m_ui8Flag == (local_20->m_TSPIFlagUnion).m_ui8Flag) {
    KVar1 = DATA_TYPE::RelativeWorldCoordinates::operator!=(&this->m_Loc,&local_20->m_Loc);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::
              operator!=(&this->m_LinVel,&local_20->m_LinVel);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::LE_EulerAngles::operator!=(&this->m_Ori,&local_20->m_Ori);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::PositionError::operator!=(&this->m_PosErr,&local_20->m_PosErr);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::OrientationError::operator!=(&this->m_OriErr,&local_20->m_OriErr);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = DATA_TYPE::LE_DeadReckoningParameter::operator!=
                                (&this->m_DeadReckoningParameter,&local_20->m_DeadReckoningParameter
                                );
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::KFIXED
                          (&local_30,&local_20->m_MeasureSpd);
                KVar1 = DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::operator!=
                                  (&this->m_MeasureSpd,&local_30);
                DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::~KFIXED(&local_30);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else if (this->m_ui8SSDLen == local_20->m_ui8SSDLen) {
                  bVar2 = std::operator!=(&this->m_vSSD,&local_20->m_vSSD);
                  if (bVar2) {
                    this_local._7_1_ = false;
                  }
                  else {
                    this_local._7_1_ = true;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL TSPI_PDU::operator == ( const TSPI_PDU & Value ) const
{
    if( LE_Header::operator       != ( Value ) )                       return false;
    if( m_TSPIFlagUnion.m_ui8Flag != Value.m_TSPIFlagUnion.m_ui8Flag ) return false;
    if( m_Loc                     != Value.m_Loc )                     return false;
    if( m_LinVel                  != Value.m_LinVel )                  return false;
    if( m_Ori                     != Value.m_Ori )                     return false;
    if( m_PosErr                  != Value.m_PosErr )                  return false;
    if( m_OriErr                  != Value.m_OriErr )                  return false;
    if( m_DeadReckoningParameter  != Value.m_DeadReckoningParameter )  return false;
    if( m_MeasureSpd              != Value.m_MeasureSpd )              return false;
    if( m_ui8SSDLen               != Value.m_ui8SSDLen )               return false;
    if( m_vSSD                    != Value.m_vSSD )                    return false;
    return true;
}